

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

void usage(char *program)

{
  uint local_14;
  wchar_t i;
  char *program_local;
  
  printf("Usage: %s [options] <test> <test> ...\n",program);
  printf("Default is to run all tests.\n");
  printf("Otherwise, specify the numbers of the tests you wish to run.\n");
  printf("Options:\n");
  printf("  -d  Dump core after any failure, for debugging.\n");
  printf("  -k  Keep all temp files.\n");
  printf("      Default: temp files for successful tests deleted.\n");
  printf("  -q  Quiet.\n");
  printf("  -r <dir>   Path to dir containing reference files.\n");
  printf("      Default: Current directory.\n");
  printf("  -s  Exit with code 2 if any tests were skipped.\n");
  printf("  -u  Keep running specified tests until one fails.\n");
  printf("  -v  Verbose.\n");
  printf("Available tests:\n");
  for (local_14 = 0; (int)local_14 < 0x288; local_14 = local_14 + 1) {
    printf("  %d: %s\n",(ulong)local_14,tests[(int)local_14].name);
  }
  exit(1);
}

Assistant:

static void
usage(const char *program)
{
	static const int limit = nitems(tests);
	int i;

	printf("Usage: %s [options] <test> <test> ...\n", program);
	printf("Default is to run all tests.\n");
	printf("Otherwise, specify the numbers of the tests you wish to run.\n");
	printf("Options:\n");
	printf("  -d  Dump core after any failure, for debugging.\n");
	printf("  -k  Keep all temp files.\n");
	printf("      Default: temp files for successful tests deleted.\n");
#ifdef PROGRAM
	printf("  -p <path>  Path to executable to be tested.\n");
	printf("      Default: path taken from " ENVBASE " environment variable.\n");
#endif
	printf("  -q  Quiet.\n");
	printf("  -r <dir>   Path to dir containing reference files.\n");
	printf("      Default: Current directory.\n");
	printf("  -s  Exit with code 2 if any tests were skipped.\n");
	printf("  -u  Keep running specified tests until one fails.\n");
	printf("  -v  Verbose.\n");
	printf("Available tests:\n");
	for (i = 0; i < limit; i++)
		printf("  %d: %s\n", i, tests[i].name);
	exit(1);
}